

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

void __thiscall
powerpc_test_cpu::print_flags(powerpc_test_cpu *this,uint32_t cr,uint32_t xer,int crf)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar1 = (byte)(crf << 2) & 0x1f;
  uVar5 = cr << bVar1;
  pcVar2 = "LT";
  if (-1 < (int)(cr << bVar1)) {
    pcVar2 = "__";
  }
  pcVar8 = "GT";
  if ((uVar5 & 0x40000000) == 0) {
    pcVar8 = "__";
  }
  pcVar3 = "EQ";
  if ((uVar5 & 0x20000000) == 0) {
    pcVar3 = "__";
  }
  pcVar6 = "SO";
  if ((uVar5 & 0x10000000) == 0) {
    pcVar6 = "__";
  }
  pcVar7 = "OV";
  if ((xer >> 0x1e & 1) == 0) {
    pcVar7 = "__";
  }
  pcVar4 = "CA";
  if ((xer >> 0x1d & 1) == 0) {
    pcVar4 = "__";
  }
  printf("%s,%s,%s,%s,%s,%s",pcVar2,pcVar8,pcVar3,pcVar6,pcVar7,pcVar4);
  return;
}

Assistant:

void powerpc_test_cpu::print_flags(uint32_t cr, uint32_t xer, int crf) const
{
	cr = cr << (4 * crf);
	printf("%s,%s,%s,%s,%s,%s",
		   (cr & CR_LT_field<0>::mask() ? "LT" : "__"),
		   (cr & CR_GT_field<0>::mask() ? "GT" : "__"),
		   (cr & CR_EQ_field<0>::mask() ? "EQ" : "__"),
		   (cr & CR_SO_field<0>::mask() ? "SO" : "__"),
		   (xer & XER_OV_field::mask()  ? "OV" : "__"),
		   (xer & XER_CA_field::mask()  ? "CA" : "__"));
}